

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O1

void __thiscall capnp::anon_unknown_0::TestCase35::run(TestCase35 *this)

{
  return;
}

Assistant:

TEST(Common, Version) {
#ifdef VERSION
  auto expectedVersion =
      kj::str(CAPNP_VERSION_MAJOR, '.', CAPNP_VERSION_MINOR, '.', CAPNP_VERSION_MICRO);
  auto devVersion =
      kj::str(CAPNP_VERSION_MAJOR, '.', CAPNP_VERSION_MINOR, "-dev");
  kj::StringPtr actualVersion = VERSION;
  KJ_ASSERT(actualVersion == expectedVersion ||
            actualVersion.startsWith(kj::str(expectedVersion, '-')) ||
            actualVersion.startsWith(kj::str(expectedVersion, '.')) ||
            (actualVersion == devVersion && CAPNP_VERSION_MICRO == 0),
            expectedVersion, actualVersion);
#endif
}